

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

void kratos::topological_sort_helper
               (GeneratorGraph *g,GeneratorNode *node,
               unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
               *visited,queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
                        *queue)

{
  bool bVar1;
  __node_base *this;
  _Node_iterator_base<kratos::GeneratorNode_*,_false> local_70;
  _Node_iterator_base<kratos::GeneratorNode_*,_false> local_68;
  GeneratorNode *local_60;
  GeneratorNode *child_node;
  Generator **child;
  iterator __end1;
  iterator __begin1;
  set<kratos::Generator_*,_std::less<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
  *__range1;
  queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
  *queue_local;
  unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
  *visited_local;
  GeneratorNode *node_local;
  GeneratorGraph *g_local;
  
  visited_local =
       (unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
        *)node;
  node_local = (GeneratorNode *)g;
  std::
  unordered_set<kratos::GeneratorNode*,std::hash<kratos::GeneratorNode*>,std::equal_to<kratos::GeneratorNode*>,std::allocator<kratos::GeneratorNode*>>
  ::emplace<kratos::GeneratorNode*&>
            ((unordered_set<kratos::GeneratorNode*,std::hash<kratos::GeneratorNode*>,std::equal_to<kratos::GeneratorNode*>,std::allocator<kratos::GeneratorNode*>>
              *)visited,(GeneratorNode **)&visited_local);
  this = &(visited_local->_M_h)._M_before_begin;
  __end1 = std::
           set<kratos::Generator_*,_std::less<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
           ::begin((set<kratos::Generator_*,_std::less<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
                    *)this);
  child = (Generator **)
          std::
          set<kratos::Generator_*,_std::less<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
          ::end((set<kratos::Generator_*,_std::less<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
                 *)this);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&child), bVar1) {
    child_node = (GeneratorNode *)
                 std::_Rb_tree_const_iterator<kratos::Generator_*>::operator*(&__end1);
    local_60 = GeneratorGraph::get_node
                         ((GeneratorGraph *)node_local,(Generator *)child_node->parent);
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
         ::find(visited,&local_60);
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
         ::end(visited);
    bVar1 = std::__detail::operator==(&local_68,&local_70);
    if (bVar1) {
      topological_sort_helper((GeneratorGraph *)node_local,local_60,visited,queue);
    }
    std::_Rb_tree_const_iterator<kratos::Generator_*>::operator++(&__end1);
  }
  std::
  queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
  ::push(queue,(value_type *)&visited_local);
  return;
}

Assistant:

void topological_sort_helper(GeneratorGraph *g, GeneratorNode *node,
                             std::unordered_set<GeneratorNode *> &visited,
                             std::queue<GeneratorNode *> &queue) {
    // mark it as visited
    visited.emplace(node);

    // visit all the child node
    for (auto const &child : node->children) {
        auto *child_node = g->get_node(child);
        if (visited.find(child_node) == visited.end()) {
            // visit it
            topological_sort_helper(g, child_node, visited, queue);
        }
    }
    queue.push(node);
}